

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

FieldDescriptor * __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::AggregateOptionFinder::FindExtension
          (AggregateOptionFinder *this,Message *message,string *name)

{
  Mutex *this_00;
  int iVar1;
  undefined4 extraout_var;
  long lVar3;
  anon_union_8_7_bfa3a334_for_Symbol_2 aVar4;
  FieldDescriptor *pFVar5;
  Symbol SVar6;
  long lVar2;
  
  this_00 = this->builder_->pool_->mutex_;
  if (this_00 != (Mutex *)0x0) {
    internal::Mutex::AssertHeld(this_00);
  }
  iVar1 = (*(message->super_MessageLite)._vptr_MessageLite[0x13])(message);
  lVar2 = CONCAT44(extraout_var,iVar1);
  SVar6 = LookupSymbolNoPlaceholder(this->builder_,name,*(string **)(lVar2 + 8),LOOKUP_ALL);
  aVar4 = SVar6.field_1;
  if (SVar6.type == MESSAGE) {
    if ((*(char *)(*(long *)(lVar2 + 0x20) + 0x58) == '\x01') &&
       (lVar3 = (long)*(int *)(aVar4.descriptor + 0x68), 0 < lVar3)) {
      pFVar5 = *(FieldDescriptor **)(aVar4.descriptor + 0x70);
      do {
        if ((((*(long *)(pFVar5 + 0x38) == lVar2) && (*(int *)(pFVar5 + 0x2c) == 0xb)) &&
            (*(int *)(pFVar5 + 0x30) == 1)) &&
           (*(FieldDescriptor **)(pFVar5 + 0x48) == (FieldDescriptor *)aVar4.descriptor)) {
          return pFVar5;
        }
        pFVar5 = pFVar5 + 0x78;
        lVar3 = lVar3 + -1;
      } while (lVar3 != 0);
    }
  }
  else if ((SVar6.type == FIELD) &&
          (*(FieldDescriptor *)(aVar4.descriptor + 0x34) != (FieldDescriptor)0x0)) {
    return (FieldDescriptor *)aVar4.descriptor;
  }
  return (FieldDescriptor *)0x0;
}

Assistant:

virtual const FieldDescriptor* FindExtension(
      Message* message, const string& name) const {
    assert_mutex_held(builder_->pool_);
    const Descriptor* descriptor = message->GetDescriptor();
    Symbol result = builder_->LookupSymbolNoPlaceholder(
        name, descriptor->full_name());
    if (result.type == Symbol::FIELD &&
        result.field_descriptor->is_extension()) {
      return result.field_descriptor;
    } else if (result.type == Symbol::MESSAGE &&
               descriptor->options().message_set_wire_format()) {
      const Descriptor* foreign_type = result.descriptor;
      // The text format allows MessageSet items to be specified using
      // the type name, rather than the extension identifier. If the symbol
      // lookup returned a Message, and the enclosing Message has
      // message_set_wire_format = true, then return the message set
      // extension, if one exists.
      for (int i = 0; i < foreign_type->extension_count(); i++) {
        const FieldDescriptor* extension = foreign_type->extension(i);
        if (extension->containing_type() == descriptor &&
            extension->type() == FieldDescriptor::TYPE_MESSAGE &&
            extension->is_optional() &&
            extension->message_type() == foreign_type) {
          // Found it.
          return extension;
        }
      }
    }
    return NULL;
  }